

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

string * __thiscall
pfederc::BodyExpr::toString_abi_cxx11_(string *__return_storage_ptr__,BodyExpr *this)

{
  pointer puVar1;
  char cVar2;
  pointer puVar3;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar3 = (this->exprs).
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->exprs).
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  cVar2 = (char)__return_storage_ptr__;
  if (puVar3 != puVar1) {
    do {
      (*((puVar3->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
         _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(local_50);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      std::__cxx11::string::push_back(cVar2);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  if (this->rct - RETURN < 3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->retExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
      ._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    std::__cxx11::string::push_back(cVar2);
    (*((this->retExpr)._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(local_50);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  if (this->rct != NONE) {
    std::__cxx11::string::push_back(cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BodyExpr::toString() const noexcept {
  std::string result;
  for (auto &expr : exprs) {
    result += expr->toString();
    result += '\n';
  }

  switch (rct) {
  case ReturnControlType::RETURN:
      result += "return";
      break;
  case ReturnControlType::CONTINUE:
      result += "continue";
      break;
  case ReturnControlType::BREAK:
      result += "break";
      break;
  default:
      break;
  };

  if (retExpr) {
    result += ' ';
    result += retExpr->toString();
  }

  if (rct != ReturnControlType::NONE)
    result += '\n';

  return result;
}